

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin2.c
# Opt level: O2

int Gia_ManAnnotateUnrolling(Gia_Man_t *p,Abc_Cex_t *pCex,int fJustMax)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *__s;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  char *__assertion;
  long lVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  
  if (p->vTruths == (Vec_Int_t *)0x0) {
    iVar7 = ((p->nObjs >> 4) + 1) - (uint)((p->nObjs & 0xfU) == 0);
    p->nTtWords = iVar7;
    lVar15 = (long)iVar7 * ((long)pCex->iFrame + 1);
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    lVar2 = 0x10;
    if (0xe < (int)lVar15 - 1U) {
      lVar2 = lVar15;
    }
    iVar7 = (int)lVar2;
    pVVar4->nCap = iVar7;
    iVar16 = 0;
    if (iVar7 == 0) {
      __s = (int *)0x0;
    }
    else {
      __s = (int *)malloc((long)iVar7 << 2);
    }
    pVVar4->pArray = __s;
    pVVar4->nSize = (int)lVar15;
    memset(__s,0,lVar15 * 4);
    p->vTruths = pVVar4;
    Gia_ManCleanMark0(p);
    uVar8 = pCex->nRegs;
    while (iVar16 <= pCex->iFrame) {
      iVar7 = 0;
      while ((uVar17 = uVar8 + iVar7, iVar7 < p->vCis->nSize - p->nRegs &&
             (pGVar5 = Gia_ManCi(p,iVar7), pGVar5 != (Gia_Obj_t *)0x0))) {
        uVar14 = (&pCex[1].iPo)[(int)uVar17 >> 5];
        *(ulong *)pGVar5 =
             *(ulong *)pGVar5 & 0xffffffffbfffffff |
             (ulong)((uint)((uVar14 >> (uVar17 & 0x1f) & 1) != 0) << 0x1e);
        if ((uVar14 >> (uVar17 & 0x1f) & 1) != 0) {
          Gia_ManAddTwo(p,iVar16,pGVar5,1);
        }
        iVar7 = iVar7 + 1;
      }
      iVar11 = 0;
      while ((iVar11 < p->nObjs && (pGVar5 = Gia_ManObj(p,iVar11), pGVar5 != (Gia_Obj_t *)0x0))) {
        uVar1 = *(ulong *)pGVar5;
        if (((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) &&
           (uVar14 = (uint)(uVar1 >> 0x20),
           uVar14 = (uVar14 >> 0x1d ^ *(uint *)(pGVar5 + -(ulong)(uVar14 & 0x1fffffff)) >> 0x1e) &
                    ((uint)(uVar1 >> 0x1d) & 7 ^ *(uint *)(pGVar5 + -(uVar1 & 0x1fffffff)) >> 0x1e)
                    & 1, *(ulong *)pGVar5 = uVar1 & 0xffffffff3fffffff | (ulong)(uVar14 << 0x1e),
           uVar14 != 0)) {
          Gia_ManAddTwo(p,iVar16,pGVar5,1);
        }
        iVar11 = iVar11 + 1;
      }
      iVar11 = 0;
      while ((iVar11 < p->vCos->nSize && (pGVar5 = Gia_ManCo(p,iVar11), pGVar5 != (Gia_Obj_t *)0x0))
            ) {
        uVar1 = *(ulong *)pGVar5;
        uVar13 = (uint)(uVar1 >> 0x1d) & 1;
        uVar14 = *(uint *)(pGVar5 + -(ulong)((uint)uVar1 & 0x1fffffff)) >> 0x1e & 1;
        *(ulong *)pGVar5 = uVar1 & 0xffffffffbfffffff | (ulong)((uVar14 ^ uVar13) << 0x1e);
        if (uVar14 != uVar13) {
          Gia_ManAddTwo(p,iVar16,pGVar5,1);
        }
        iVar11 = iVar11 + 1;
      }
      if (iVar16 == pCex->iFrame) {
        uVar8 = uVar8 + iVar7;
        break;
      }
      iVar16 = iVar16 + 1;
      iVar7 = 0;
      while (((uVar8 = uVar17, iVar7 < p->nRegs &&
              (pGVar5 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar7), pGVar5 != (Gia_Obj_t *)0x0
              )) && (pGVar6 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar7),
                    pGVar6 != (Gia_Obj_t *)0x0))) {
        uVar8 = *(uint *)pGVar5 >> 0x1e & 1;
        *(ulong *)pGVar6 = *(ulong *)pGVar6 & 0xffffffffbfffffff | (ulong)(uVar8 << 0x1e);
        if (uVar8 != 0) {
          Gia_ManAddTwo(p,iVar16,pGVar6,1);
        }
        iVar7 = iVar7 + 1;
      }
    }
    if (uVar8 == pCex->nBits) {
      pGVar5 = Gia_ManPo(p,pCex->iPo);
      uVar8 = *(uint *)pGVar5;
      if ((uVar8 >> 0x1e & 1) == 0) {
        puts("Counter-example is invalid.");
      }
      Gia_ManCleanMark0(p);
      pGVar5 = Gia_ManPo(p,pCex->iPo);
      pGVar5->field_0x3 = pGVar5->field_0x3 | 0x40;
      Gia_ManAddTwo(p,pCex->iFrame,pGVar5,2);
      iVar7 = pCex->iFrame;
      while (-1 < iVar7) {
        iVar16 = 0;
        while ((iVar16 < p->vCos->nSize &&
               (pGVar5 = Gia_ManCo(p,iVar16), pGVar5 != (Gia_Obj_t *)0x0))) {
          uVar1 = *(ulong *)pGVar5 >> 0x1e;
          uVar9 = (ulong)((uint)*(ulong *)pGVar5 & 0x1fffffff);
          *(ulong *)(pGVar5 + -uVar9) =
               *(ulong *)(pGVar5 + -uVar9) & 0xffffffffbfffffff | (ulong)(((uint)uVar1 & 1) << 0x1e)
          ;
          if ((uVar1 & 1) != 0) {
            uVar1 = *(ulong *)pGVar5;
            *(ulong *)pGVar5 = uVar1 & 0xffffffffbfffffff;
            Gia_ManAddTwo(p,iVar7,pGVar5 + -(ulong)((uint)uVar1 & 0x1fffffff),2);
          }
          iVar16 = iVar16 + 1;
        }
        iVar16 = p->nObjs;
        while (1 < iVar16) {
          iVar16 = iVar16 + -1;
          pGVar5 = Gia_ManObj(p,iVar16);
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          uVar17 = (uint)*(ulong *)pGVar5;
          if ((uVar17 & 0xc0000000) == 0x40000000 && (~uVar17 & 0x1fffffff) != 0) {
            *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xffffffff3fffffff;
            uVar14 = Gia_ManGetTwo(p,iVar7,pGVar5);
            uVar14 = uVar14 & 1;
            uVar13 = Gia_ManGetTwo(p,iVar7,pGVar5 + -(*(ulong *)pGVar5 & 0x1fffffff));
            uVar18 = (uint)(*(ulong *)pGVar5 >> 0x1d) & 1;
            uVar12 = uVar18 ^ uVar13 & 1;
            uVar3 = Gia_ManGetTwo(p,iVar7,pGVar5 + -(*(ulong *)pGVar5 >> 0x20 & 0x1fffffff));
            uVar1 = *(ulong *)pGVar5;
            uVar17 = (uint)(uVar1 >> 0x20);
            uVar10 = uVar17 >> 0x1d & 1;
            if (uVar12 == (uVar10 ^ uVar3 & 1)) {
              if (uVar14 != uVar12) {
                __assert_fail("Value == (Value0 & Value1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                              ,0x81,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
              }
              if (uVar14 == 0 && fJustMax == 0) goto LAB_0043f0bc;
              pGVar5[-(uVar1 >> 0x20 & 0x1fffffff)].field_0x3 =
                   pGVar5[-(uVar1 >> 0x20 & 0x1fffffff)].field_0x3 | 0x40;
              *(ulong *)(pGVar5 + -(*(ulong *)pGVar5 & 0x1fffffff)) =
                   *(ulong *)(pGVar5 + -(*(ulong *)pGVar5 & 0x1fffffff)) | 0x40000000;
              Gia_ManAddTwo(p,iVar7,pGVar5 + -(*(ulong *)pGVar5 & 0x1fffffff),2);
LAB_0043f104:
              uVar17 = *(uint *)&pGVar5->field_0x4;
            }
            else {
              if ((uVar13 & 1) != uVar18) {
                if ((uVar3 & 1) != uVar10) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                                ,0x9a,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)")
                  ;
                }
                if (uVar14 != 0) {
                  __assert_fail("Value == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                                ,0x96,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)")
                  ;
                }
                pGVar5[-(ulong)(uVar17 & 0x1fffffff)].field_0x3 =
                     pGVar5[-(ulong)(uVar17 & 0x1fffffff)].field_0x3 | 0x40;
                goto LAB_0043f104;
              }
              if (uVar14 != 0) {
                __assert_fail("Value == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                              ,0x90,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
              }
LAB_0043f0bc:
              pGVar5[-(ulong)((uint)uVar1 & 0x1fffffff)].field_0x3 =
                   pGVar5[-(ulong)((uint)uVar1 & 0x1fffffff)].field_0x3 | 0x40;
              uVar17 = (uint)*(undefined8 *)pGVar5;
            }
            Gia_ManAddTwo(p,iVar7,pGVar5 + -(ulong)(uVar17 & 0x1fffffff),2);
          }
        }
        if (iVar7 == 0) break;
        iVar16 = 0;
        while ((iVar16 < p->vCis->nSize - p->nRegs &&
               (pGVar5 = Gia_ManCi(p,iVar16), pGVar5 != (Gia_Obj_t *)0x0))) {
          pGVar5->field_0x3 = pGVar5->field_0x3 & 0xbf;
          iVar16 = iVar16 + 1;
        }
        iVar7 = iVar7 + -1;
        iVar16 = 0;
        while (((iVar16 < p->nRegs &&
                (pGVar5 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar16),
                pGVar5 != (Gia_Obj_t *)0x0)) &&
               (pGVar6 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar16),
               pGVar6 != (Gia_Obj_t *)0x0))) {
          uVar17 = *(uint *)pGVar6 >> 0x1e & 1;
          *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xffffffffbfffffff | (ulong)(uVar17 << 0x1e);
          if (uVar17 != 0) {
            pGVar6->field_0x3 = pGVar6->field_0x3 & 0xbf;
            Gia_ManAddTwo(p,iVar7,pGVar5,2);
          }
          iVar16 = iVar16 + 1;
        }
      }
      Gia_ManCleanMark0(p);
      return uVar8 >> 0x1e & 1;
    }
    __assertion = "iBit == pCex->nBits";
    uVar8 = 99;
  }
  else {
    __assertion = "p->vTruths == NULL";
    uVar8 = 0x4d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                ,uVar8,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
}

Assistant:

int Gia_ManAnnotateUnrolling( Gia_Man_t * p, Abc_Cex_t * pCex, int fJustMax )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, f, k, Value, Value0, Value1, iBit;
    // start storage for internal info
    assert( p->vTruths == NULL );
    p->nTtWords = Abc_BitWordNum( 2 * Gia_ManObjNum(p) );
    p->vTruths  = Vec_IntStart( (pCex->iFrame + 1) * p->nTtWords );
    // assign values to all objects (const0 and RO in frame0 are assigned 0)
    Gia_ManCleanMark0(p);
    for ( f = 0, iBit = pCex->nRegs; f <= pCex->iFrame; f++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            if ( (pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++)) )
                Gia_ManAddTwo( p, f, pObj, 1 );
        Gia_ManForEachAnd( p, pObj, k )
            if ( (pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj))) )
                Gia_ManAddTwo( p, f, pObj, 1 );
        Gia_ManForEachCo( p, pObj, k )
            if ( (pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) )
                Gia_ManAddTwo( p, f, pObj, 1 );
        if ( f == pCex->iFrame )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            if ( (pObjRo->fMark0 = pObjRi->fMark0) )
                Gia_ManAddTwo( p, f+1, pObjRo, 1 );
    }
    assert( iBit == pCex->nBits );
    // check the output value
    RetValue = Gia_ManPo(p, pCex->iPo)->fMark0;
    if ( RetValue != 1 )
        printf( "Counter-example is invalid.\n" );
    // assign justification to nodes
    Gia_ManCleanMark0(p);
    pObj = Gia_ManPo(p, pCex->iPo);
    pObj->fMark0 = 1;
    Gia_ManAddTwo( p, pCex->iFrame, pObj, 2 );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // transfer to CO drivers
        Gia_ManForEachCo( p, pObj, k )
            if ( (Gia_ObjFanin0(pObj)->fMark0 = pObj->fMark0) )
            {
                pObj->fMark0 = 0;
                Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
            }
        // compute justification
        Gia_ManForEachAndReverse( p, pObj, k )
        {
            if ( !pObj->fMark0 ) 
                continue;
            pObj->fMark0 = 0;
            Value = (1 & Gia_ManGetTwo(p, f, pObj));
            Value0 = (1 & Gia_ManGetTwo(p, f, Gia_ObjFanin0(pObj))) ^ Gia_ObjFaninC0(pObj);
            Value1 = (1 & Gia_ManGetTwo(p, f, Gia_ObjFanin1(pObj))) ^ Gia_ObjFaninC1(pObj);
            if ( Value0 == Value1 )
            {
                assert( Value == (Value0 & Value1) );
                if ( fJustMax || Value == 1 )
                {
                    Gia_ObjFanin0(pObj)->fMark0 = Gia_ObjFanin1(pObj)->fMark0 = 1;
                    Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
                    Gia_ManAddTwo( p, f, Gia_ObjFanin1(pObj), 2 );
                }
                else
                {
                    Gia_ObjFanin0(pObj)->fMark0 = 1;
                    Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
                }
            }
            else if ( Value0 == 0 )
            {
                assert( Value == 0 );
                Gia_ObjFanin0(pObj)->fMark0 = 1;
                Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
            }
            else if ( Value1 == 0 )
            {
                assert( Value == 0 );
                Gia_ObjFanin1(pObj)->fMark0 = 1;
                Gia_ManAddTwo( p, f, Gia_ObjFanin1(pObj), 2 );
            }
            else assert( 0 );
        }
        if ( f == 0 )
            break;
        // transfer to RIs
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = 0;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            if ( (pObjRi->fMark0 = pObjRo->fMark0) )
            {
                pObjRo->fMark0 = 0;
                Gia_ManAddTwo( p, f-1, pObjRi, 2 );
            }
    }
    Gia_ManCleanMark0(p);
    return RetValue;
}